

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O3

void __thiscall
bloaty::wasm::ReadCodeSection
          (wasm *this,Section *section,IndexedNames *names,uint32_t num_imports,RangeSink *sink)

{
  char *pcVar1;
  RangeSink *pRVar2;
  char cVar3;
  char cVar4;
  uint64_t uVar5;
  const_iterator cVar6;
  long *plVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  char *pcVar12;
  uint __val;
  char *pcVar13;
  ulong filesize;
  size_type __rlen;
  ulong uVar14;
  string_view symbol;
  string_view name_00;
  string_view name_01;
  string name;
  string __str;
  string local_d0;
  RangeSink *local_b0;
  string_view local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  uint local_68;
  long local_60 [2];
  uint64_t local_50;
  uint64_t local_48;
  Section *local_40;
  IndexedNames *local_38;
  
  local_b0 = (RangeSink *)CONCAT44(in_register_0000000c,num_imports);
  local_a8._M_len = *(size_t *)(this + 0x38);
  local_a8._M_str = *(char **)(this + 0x40);
  __val = 0;
  local_40 = section;
  local_38 = names;
  local_48 = ReadLEB128Internal(false,0x20,&local_a8);
  pcVar13 = local_a8._M_str;
  uVar14 = local_a8._M_len;
  if ((int)local_48 != 0) {
    do {
      uVar5 = ReadLEB128Internal(false,0x20,&local_a8);
      filesize = (ulong)(uint)(((int)uVar5 - (int)pcVar13) + (int)local_a8._M_str);
      if (uVar14 < filesize) {
        Throw("region out-of-bounds",0x5d);
      }
      uVar11 = uVar5 & 0xffffffff;
      uVar14 = local_a8._M_len - uVar11;
      if (local_a8._M_len < uVar11) {
        Throw("region out-of-bounds",100);
      }
      pcVar12 = local_a8._M_str + uVar11;
      local_d0._M_dataplus._M_p._0_4_ = (int)local_38 + __val;
      local_a8._M_len = uVar14;
      local_a8._M_str = pcVar12;
      cVar6 = std::
              _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_40,(key_type_conflict *)&local_d0);
      pRVar2 = local_b0;
      if (cVar6.
          super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        cVar4 = '\x01';
        if (9 < __val) {
          uVar11 = (ulong)__val;
          cVar3 = '\x04';
          do {
            cVar4 = cVar3;
            uVar8 = (uint)uVar11;
            if (uVar8 < 100) {
              cVar4 = cVar4 + -2;
              goto LAB_001a189a;
            }
            if (uVar8 < 1000) {
              cVar4 = cVar4 + -1;
              goto LAB_001a189a;
            }
            if (uVar8 < 10000) goto LAB_001a189a;
            uVar11 = uVar11 / 10000;
            cVar3 = cVar4 + '\x04';
          } while (99999 < uVar8);
          cVar4 = cVar4 + '\x01';
        }
LAB_001a189a:
        local_70 = local_60;
        std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,local_68,__val);
        sink = (RangeSink *)0x5;
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x339c8c);
        local_90 = &local_80;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_80 = *plVar9;
          lStack_78 = plVar7[3];
        }
        else {
          local_80 = *plVar9;
          local_90 = (long *)*plVar7;
        }
        local_88 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d0.field_2._M_allocated_capacity = *psVar10;
          local_d0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar10;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        pcVar1 = (local_b0->file_->data_)._M_str;
        if ((pcVar1 <= pcVar13) && (pcVar13 < pcVar1 + (local_b0->file_->data_)._M_len)) {
          sink = (RangeSink *)(pcVar13 + -(long)pcVar1);
          name_01._M_str = local_d0._M_dataplus._M_p;
          name_01._M_len = local_d0._M_string_length;
          RangeSink::AddFileRange(local_b0,"wasm_function",name_01,(uint64_t)sink,filesize);
        }
      }
      else {
        symbol._M_str._0_4_ = local_b0->data_source_;
        symbol._M_len =
             *(undefined8 *)
              ((long)cVar6.
                     super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     ._M_cur + 0x10);
        symbol._M_str._4_4_ = 0;
        local_50 = filesize;
        ItaniumDemangle_abi_cxx11_
                  (&local_d0,
                   *(bloaty **)
                    ((long)cVar6.
                           super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                           ._M_cur + 0x18),symbol,(DataSource)sink);
        pcVar1 = (pRVar2->file_->data_)._M_str;
        if ((pcVar1 <= pcVar13) && (pcVar13 < pcVar1 + (pRVar2->file_->data_)._M_len)) {
          sink = (RangeSink *)(pcVar13 + -(long)pcVar1);
          name_00._M_str = local_d0._M_dataplus._M_p;
          name_00._M_len = local_d0._M_string_length;
          RangeSink::AddFileRange(local_b0,"wasm_function",name_00,(uint64_t)sink,local_50);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      __val = __val + 1;
      pcVar13 = pcVar12;
    } while (__val != (uint)local_48);
  }
  return;
}

Assistant:

void ReadCodeSection(const Section& section, const IndexedNames& names,
                     uint32_t num_imports, RangeSink* sink) {
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view func = data;
    uint32_t size = ReadVarUInt32(&data);
    uint32_t total_size = size + (data.data() - func.data());

    func = StrictSubstr(func, 0, total_size);
    data = StrictSubstr(data, size);

    auto iter = names.find(num_imports + i);

    if (iter == names.end()) {
      std::string name = "func[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_function", name, func);
    } else {
      sink->AddFileRange("wasm_function", ItaniumDemangle(iter->second, sink->data_source()), func);
    }
  }
}